

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_set_quality(j_compress_ptr cinfo,int quality,boolean force_baseline)

{
  int scale_factor;
  boolean force_baseline_local;
  int quality_local;
  j_compress_ptr cinfo_local;
  
  scale_factor = jpeg_quality_scaling(quality);
  jpeg_set_linear_quality(cinfo,scale_factor,force_baseline);
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_quality (j_compress_ptr cinfo, int quality, boolean force_baseline)
/* Set or change the 'quality' (quantization) setting, using default tables.
 * This is the standard quality-adjusting entry point for typical user
 * interfaces; only those who want detailed control over quantization tables
 * would use the preceding three routines directly.
 */
{
  /* Convert user 0-100 rating to percentage scaling */
  quality = jpeg_quality_scaling(quality);

  /* Set up standard quality tables */
  jpeg_set_linear_quality(cinfo, quality, force_baseline);
}